

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

size_t __thiscall
kj::FdInputStream::tryRead(FdInputStream *this,ArrayPtr<unsigned_char> buffer,size_t minBytes)

{
  int code;
  uchar *puVar1;
  void *pvVar2;
  Fault local_78;
  Fault f;
  SyscallResult local_4c;
  undefined1 auStack_48 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  byte *max;
  byte *min;
  byte *pos;
  size_t minBytes_local;
  FdInputStream *this_local;
  ArrayPtr<unsigned_char> buffer_local;
  
  buffer_local.ptr = (uchar *)buffer.size_;
  this_local = (FdInputStream *)buffer.ptr;
  min = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
  puVar1 = min + minBytes;
  ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)&this_local);
  for (; min < puVar1; min = (byte *)(_auStack_48 + (long)min)) {
    f.exception = (Exception *)auStack_48;
    local_4c = kj::_::Debug::
               syscall<kj::FdInputStream::tryRead(kj::ArrayPtr<unsigned_char>,unsigned_long)::__0>
                         ((anon_class_32_4_b05fb1ff *)&f,false);
    pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_4c);
    if (pvVar2 == (void *)0x0) {
      code = kj::_::Debug::SyscallResult::getErrorNumber(&local_4c);
      kj::_::Debug::Fault::Fault<int,int&>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x15f,code,"n = miniposix::read(fd, pos, max - pos)","fd",&this->fd);
      kj::_::Debug::Fault::fatal(&local_78);
    }
    if (_auStack_48 == (char *)0x0) break;
  }
  puVar1 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
  return (long)min - (long)puVar1;
}

Assistant:

size_t FdInputStream::tryRead(ArrayPtr<byte> buffer, size_t minBytes) {
  byte* pos = buffer.begin();
  byte* min = pos + minBytes;
  byte* max = buffer.end();

  while (pos < min) {
    miniposix::ssize_t n;
    KJ_SYSCALL(n = miniposix::read(fd, pos, max - pos), fd);
    if (n == 0) {
      break;
    }
    pos += n;
  }

  return pos - buffer.begin();
}